

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maph.h
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> *
convolute(vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,Settings *s,
         Data *d,vector<unsigned_int,_std::allocator<unsigned_int>_> *kernel)

{
  double *pdVar1;
  double dVar2;
  int iVar3;
  pointer puVar4;
  pointer pdVar5;
  pointer pdVar6;
  undefined1 auVar7 [16];
  double dVar8;
  double dVar9;
  pointer puVar10;
  ostream *poVar11;
  uint uVar12;
  ulong uVar13;
  Data *pDVar14;
  size_type __n;
  int iVar15;
  ulong uVar16;
  long lVar17;
  double dVar18;
  double dVar19;
  undefined8 uVar20;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double dVar23;
  allocator<char> local_14d;
  uint local_14c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_148;
  Data *local_140;
  double local_138;
  uint local_12c;
  undefined1 local_128 [16];
  double local_118;
  double local_110;
  double local_108;
  double local_100;
  double local_f8;
  double local_f0;
  double local_e8;
  double local_e0;
  double local_d8;
  string pstr;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  __n = (long)s->ny * (long)s->nx;
  s->nxy = (int)__n;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (__return_storage_ptr__,__n,(allocator_type *)&pstr);
  puVar4 = (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar10 = (__return_storage_ptr__->
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start; puVar10 != puVar4; puVar10 = puVar10 + 1) {
    *puVar10 = 0;
  }
  local_148 = __return_storage_ptr__;
  std::__cxx11::string::string<std::allocator<char>>((string *)&pstr,"=",&local_14d);
  local_140 = d;
  if (s->sampling == pointwise) {
    poVar11 = std::operator<<((ostream *)&std::cout,"Convoluting pointwise...");
    std::endl<char,std::char_traits<char>>(poVar11);
    std::__cxx11::string::string((string *)&local_70,(string *)&pstr);
    printBar(0x46,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    iVar15 = 0;
    pDVar14 = local_140;
    for (lVar17 = 0; iVar3 = pDVar14->ntrkptsum, lVar17 < iVar3; lVar17 = lVar17 + 1) {
      std::__cxx11::string::string((string *)&local_50,(string *)&pstr);
      printProgress(iVar15 / iVar3,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      pDVar14 = local_140;
      addKernel(s,(local_140->lats).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar17],
                (local_140->lons).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar17],local_148,kernel,1.0);
      iVar15 = iVar15 + 0x46;
    }
  }
  else {
    poVar11 = std::operator<<((ostream *)&std::cout,"Convoluting linearly...");
    std::endl<char,std::char_traits<char>>(poVar11);
    std::__cxx11::string::string((string *)&local_90,(string *)&pstr);
    printBar(0x46,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    uVar13 = 0;
    local_138 = 0.0;
    local_128 = ZEXT816(0);
    local_14c = 0;
    local_110 = 1.0;
    while( true ) {
      iVar15 = d->ntrkptsum;
      uVar12 = (uint)uVar13;
      if (iVar15 <= (int)uVar12) break;
      std::__cxx11::string::string((string *)&local_b0,(string *)&pstr);
      printProgress((int)(uVar12 * 0x46) / iVar15,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      d = local_140;
      uVar16 = (ulong)local_14c;
      if (uVar12 == (local_140->iEndSeg).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar16]) {
        local_14c = local_14c + 1;
        uVar13 = (ulong)(uVar12 + 1);
        dVar18 = 0.0;
      }
      else {
        if (s->mapType != heat) {
          pdVar5 = (local_140->scas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          local_118 = pdVar5[(int)uVar12];
          local_108 = pdVar5[(long)(int)uVar12 + 1];
        }
        pdVar5 = (local_140->lats).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar6 = (local_140->lons).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_e0 = pdVar6[(int)uVar12];
        local_f0 = pdVar5[(int)uVar12];
        local_e8 = pdVar6[(long)(int)uVar12 + 1] - local_e0;
        local_f8 = pdVar5[(long)(int)uVar12 + 1] - local_f0;
        local_d8 = SQRT(local_f8 * local_f8 + local_e8 * local_e8) / s->degPerPix;
        local_12c = uVar12 + 1;
        local_100 = local_108 - local_118;
        uVar20 = 0;
        dVar18 = local_138;
        while (auVar22._8_8_ = uVar20, auVar22._0_8_ = dVar18, dVar18 < 1.0) {
          if (s->mapType != heat) {
            local_110 = (((dVar18 * local_100 + local_118) - s->mins) * 1000000000.0) /
                        (s->maxs - s->mins);
          }
          local_128 = auVar22;
          addKernel(s,dVar18 * local_f8 + local_f0,dVar18 * local_e8 + local_e0,local_148,kernel,
                    local_110);
          if ((local_d8 == 0.0) && (!NAN(local_d8))) {
            auVar22._8_8_ = 0;
            auVar22._0_8_ = local_138;
            uVar13 = (ulong)local_12c;
            local_128._8_8_ = 0;
            local_128._0_8_ = local_138;
            break;
          }
          uVar20 = extraout_XMM0_Qb;
          dVar18 = ((double)s->r * s->step) / local_d8 + (double)local_128._0_8_;
        }
        dVar18 = auVar22._0_8_;
        if (((local_d8 != 0.0) || (NAN(local_d8))) && (1.0 <= dVar18)) {
          pdVar5 = (d->lats).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          dVar19 = (double)s->r * s->step;
          uVar13 = (ulong)(int)uVar13;
          dVar23 = local_d8;
          do {
            dVar18 = auVar22._0_8_;
            if (((d->iEndSeg).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar16] <= (uint)uVar13) ||
               ((long)d->ntrkptsum <= (long)uVar13)) break;
            dVar18 = pdVar5[uVar13 + 1];
            dVar2 = pdVar5[uVar13 + 2];
            pdVar1 = (d->lons).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar13 + 1;
            dVar8 = *pdVar1;
            dVar9 = pdVar1[1];
            if (((dVar8 != dVar9) || ((NAN(dVar8) || NAN(dVar9) || (dVar18 != dVar2)))) ||
               (NAN(dVar18) || NAN(dVar2))) {
              dVar18 = SQRT((dVar2 - dVar18) * (dVar2 - dVar18) + (dVar9 - dVar8) * (dVar9 - dVar8))
                       / s->degPerPix;
              auVar21._0_8_ = dVar19 - dVar23 * (1.0 - (double)local_128._0_8_);
              auVar21._8_8_ = dVar19;
              auVar7._8_8_ = dVar18;
              auVar7._0_8_ = dVar18;
              auVar22 = divpd(auVar21,auVar7);
              local_128._8_8_ = auVar22._8_8_;
              local_128._0_8_ = auVar22._0_8_ - auVar22._8_8_;
              dVar23 = dVar18;
            }
            uVar13 = uVar13 + 1;
            dVar18 = auVar22._0_8_;
          } while (1.0 <= dVar18);
        }
      }
      local_138 = 0.0;
      if (0.0 <= dVar18) {
        local_138 = dVar18;
      }
    }
  }
  poVar11 = std::operator<<((ostream *)&std::cout,"|");
  std::endl<char,std::char_traits<char>>(poVar11);
  std::__cxx11::string::~string((string *)&pstr);
  return local_148;
}

Assistant:

std::vector<unsigned int> convolute(Settings& s, Data& d,
		std::vector<unsigned int>& kernel)
{
	s.nxy = s.nx * s.ny;
	std::vector<unsigned int> img(s.nxy);

	// Initialize
	std::fill(img.begin(), img.end(), 0);

	// Number of characters in progress bar
	int np = 70;
	const std::string pstr = "=";

	// Kernel scalar for map types other than heat
	double scalar = 1.0;
	double scaleMax = 1.e9;

	if (s.sampling == pointwise)
	{
		std::cout << "Convoluting pointwise..." << std::endl;
		printBar(np, pstr);
		for (int i = 0; i < d.ntrkptsum; i++)
		{
			printProgress(np * i / d.ntrkptsum, pstr);
			addKernel(s, d.lats[i], d.lons[i], img, kernel, scalar);
		}
	}
	else
	{
		std::cout << "Convoluting linearly..." << std::endl;
		printBar(np, pstr);
		unsigned int iseg = 0;
		double dd = 0.0;
		double dd0 = 0.0;

		int i = 0;
		while (i < d.ntrkptsum)
		{
			double dpix;
			printProgress(np * i / d.ntrkptsum, pstr);
			if (i == d.iEndSeg[iseg])
			{
				// Final point
				iseg++;
				i++;
				dd = 0.0;
			}
			else
			{
				//std::cout << "sampling dd = " << dd << std::endl;

				// Linear subsampling

				double x0 = d.lons[i];
				double y0 = d.lats[i];
				double x1 = d.lons[i + 1];
				double y1 = d.lats[i + 1];

				double s0, s1;
				if (s.mapType != heat)
				{
					s0 = d.scas[i];
					s1 = d.scas[i + 1];
				}

				// Distance between trackpoint i and i+1 in units of
				// pixels.  Already calculated?
				dpix = sqrt(pow(x1 - x0, 2) + pow(y1 - y0, 2)) / s.degPerPix;

				while (dd < 1.0)
				{
					//std::cout << "dd = " << dd << std::endl;

					double lat = y0 + dd * (y1 - y0);
					double lon = x0 + dd * (x1 - x0);

					if (s.mapType != heat)
					{
						double sca = s0 + dd * (s1 - s0);
						scalar = scaleMax * (sca - s.mins) / (s.maxs - s.mins);
						//std::cout << "scalar = " << scalar << "\n";
					}

					addKernel(s, lat, lon, img, kernel, scalar);

					dd0 = dd;
					if (dpix == 0.0)
					{
						i++;
						break;
					}
					else
					{
						// Move a step of a fraction of the kernel radius
						dd += s.step * s.r / dpix;
					}

				}
			}
			//std::cout << "d.iEndSeg[iseg] = " << d.iEndSeg[iseg] << "\n";

			// Offset next kernel one step size away from last one
			double dpix0 = dpix;
			if (dpix0 != 0.0)
			{
				while (dd >= 1.0 && i < d.iEndSeg[iseg] && i < d.ntrkptsum)
				{
					i++;
					//std::cout << "i = " << i << std::endl;

					double x0 = d.lons[i];
					double y0 = d.lats[i];
					double x1 = d.lons[i + 1];
					double y1 = d.lats[i + 1];

					if (x0 != x1 || y0 != y1)
					{
						dpix0 = dpix;
						dpix = sqrt(pow(x1 - x0, 2) + pow(y1 - y0, 2)) / s.degPerPix;

						// Residual distance leftover from the last
						// line, as a fraction of last line's length
						double ddres = 1.0 - dd0;

						// Residual in pixels
						double pixres = ddres * dpix0;

						// Offset from new starting point in pixels
						double pixstart = s.step * s.r - pixres;

						// Dimensionless offset (and hypothetical
						// previous point in case of overflow)
						dd = pixstart / dpix;
						dd0 = dd - s.step * s.r / dpix;

						//std::cout << "dd = " << dd << std::endl;
					}
				}
			}

			// Just in case
			dd = std::max(dd, 0.0);

		}
	}
	std::cout << "|" << std::endl;

	//std::cout << img << std::endl;
	return img;
}